

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMapKey
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  long lVar1;
  string *psVar2;
  long lVar3;
  string *element_name;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  char *pcVar7;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar8;
  Symbol SVar9;
  size_type __dnew;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(int *)(field + 0x30) == 3) {
    if ((*(uint *)(field + 0x2c) & 0xfffffffe) == 10) {
      lVar1 = *(long *)(field + 0x48);
      if (lVar1 == 0) {
        psVar2 = *(string **)(field + 8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_98 = (long *)0x1a;
        local_b8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
        local_b8.field_2._M_allocated_capacity = (size_type)local_98;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 10) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xb) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xc) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xd) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xe) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xf) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x11) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x12) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x13) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x14) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x15) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x16) = 'y';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x17) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x18) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0x19) = '.';
        *(undefined8 *)local_b8._M_dataplus._M_p = 0x6f6e20646c756f43;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 8) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 9) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 10) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xb) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xc) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xd) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xe) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p + 0xf) = 'f';
        local_b8._M_string_length = (size_type)local_98;
        local_b8._M_dataplus._M_p[(long)local_98] = '\0';
        AddError(this,psVar2,&proto->super_Message,TYPE,&local_b8);
      }
      else {
        psVar2 = *(string **)(*(long *)(field + 0x60) + 0x48);
        local_98 = &local_88;
        lVar3 = **(long **)(lVar1 + 8);
        local_78 = lVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,lVar3,(*(long **)(lVar1 + 8))[1] + lVar3);
        std::__cxx11::string::append((char *)&local_98);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_98,(ulong)(psVar2->_M_dataplus)._M_p);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        plVar6 = plVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar6) {
          local_b8.field_2._M_allocated_capacity = *plVar6;
          local_b8.field_2._8_8_ = plVar4[3];
        }
        else {
          local_b8.field_2._M_allocated_capacity = *plVar6;
          local_b8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_b8._M_string_length = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        SVar9 = LookupSymbol(this,psVar2,&local_b8,PLACEHOLDER_MESSAGE,LOOKUP_ALL);
        aVar8 = SVar9.field_1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if ((SVar9.type == NULL_SYMBOL) || (aVar8.descriptor[0x34] == (Descriptor)0x1)) {
          element_name = *(string **)(field + 8);
          std::operator+(&local_50,"Could not find field named \"",psVar2);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_60 = *plVar6;
            lStack_58 = plVar4[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar6;
            local_70 = (long *)*plVar4;
          }
          local_68 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,**(ulong **)(local_78 + 8));
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_88 = *plVar6;
            lStack_80 = plVar4[3];
            local_98 = &local_88;
          }
          else {
            local_88 = *plVar6;
            local_98 = (long *)*plVar4;
          }
          local_90 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
          pcVar7 = (char *)(puVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar7) {
            local_b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
            local_b8.field_2._8_8_ = puVar5[3];
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          }
          else {
            local_b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
            local_b8._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_b8._M_string_length = puVar5[1];
          *puVar5 = pcVar7;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          AddError(this,element_name,&proto->super_Message,TYPE,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) {
            return;
          }
          goto LAB_001d969e;
        }
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        if (*(int *)(aVar8.descriptor + 0x30) == 3) {
          psVar2 = *(string **)(field + 8);
          local_98 = (long *)0x27;
          local_b8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
          local_b8.field_2._M_allocated_capacity = (size_type)local_98;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x10) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x11) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x12) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x13) = 'm';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x14) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x15) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x16) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x17) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x18) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x19) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x1a) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x1b) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x1c) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x1d) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x1e) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x1f) = 'd';
          *(undefined8 *)local_b8._M_dataplus._M_p = 0x2079656b5f70616d;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 8) = 'm';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 9) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 10) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0xb) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0xc) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0xd) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0xe) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0xf) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x1f) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x20) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x21) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x22) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x23) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x24) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x25) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p + 0x26) = '.';
          local_b8._M_string_length = (size_type)local_98;
          local_b8._M_dataplus._M_p[(long)local_98] = '\0';
          AddError(this,psVar2,&proto->super_Message,TYPE,&local_b8);
        }
        else {
          if ((*(uint *)(aVar8.descriptor + 0x2c) & 0xfffffffe) != 10) {
            ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x58))->descriptor =
                 (Descriptor *)aVar8;
            return;
          }
          psVar2 = *(string **)(field + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"map key must name a scalar or string field.","");
          AddError(this,psVar2,&proto->super_Message,TYPE,&local_b8);
        }
      }
    }
    else {
      psVar2 = *(string **)(field + 8);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_98 = (long *)0x38;
      local_b8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
      local_b8.field_2._M_allocated_capacity = (size_type)local_98;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x20) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x21) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x22) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x23) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x24) = 'w';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x25) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x26) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x27) = 'h';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x28) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x29) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x2a) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x2b) = 'm';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x2c) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x2d) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x2e) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x2f) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x10) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x11) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x12) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x13) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x14) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x15) = 'w';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x16) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x17) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x18) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x19) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x1a) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x1b) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x1c) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x1d) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x1e) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x1f) = 'e';
      *(undefined8 *)local_b8._M_dataplus._M_p = 0x657079742070616d;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 8) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 9) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 10) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0xb) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0xc) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0xd) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0xe) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0xf) = 'y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x30) = 'g';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x31) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x32) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x33) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x34) = 'y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x35) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x36) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p + 0x37) = '.';
      local_b8._M_string_length = (size_type)local_98;
      local_b8._M_dataplus._M_p[(long)local_98] = '\0';
      AddError(this,psVar2,&proto->super_Message,TYPE,&local_b8);
    }
  }
  else {
    psVar2 = *(string **)(field + 8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_98 = (long *)0x2d;
    local_b8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
    local_b8.field_2._M_allocated_capacity = (size_type)local_98;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x1d) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x1f) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x20) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x21) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x22) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x23) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x24) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x25) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x26) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x27) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x28) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x29) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x2a) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x2b) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x2c) = '.';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x10) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x11) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x12) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x13) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x14) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x15) = 'w';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x16) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x17) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x18) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x19) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x1a) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x1b) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x1c) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x1d) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x1e) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0x1f) = 'p';
    *(undefined8 *)local_b8._M_dataplus._M_p = 0x657079742070616d;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 8) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 9) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0xb) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0xc) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0xd) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0xe) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p + 0xf) = 'y';
    local_b8._M_string_length = (size_type)local_98;
    local_b8._M_dataplus._M_p[(long)local_98] = '\0';
    AddError(this,psVar2,&proto->super_Message,TYPE,&local_b8);
  }
  local_50.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
  local_50._M_dataplus._M_p = local_b8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    return;
  }
LAB_001d969e:
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void DescriptorBuilder::ValidateMapKey(FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  if (!field->is_repeated()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map type is only allowed for repeated fields.");
    return;
  }

  if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map type is only allowed for fields with a message type.");
    return;
  }

  const Descriptor* item_type = field->message_type();
  if (item_type == NULL) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Could not find field type.");
    return;
  }

  // Find the field in item_type named by "experimental_map_key"
  const string& key_name = field->options().experimental_map_key();
  const Symbol key_symbol = LookupSymbol(
      key_name,
      // We append ".key_name" to the containing type's name since
      // LookupSymbol() searches for peers of the supplied name, not
      // children of the supplied name.
      item_type->full_name() + "." + key_name);

  if (key_symbol.IsNull() || key_symbol.field_descriptor->is_extension()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Could not find field named \"" + key_name + "\" in type \"" +
             item_type->full_name() + "\".");
    return;
  }
  const FieldDescriptor* key_field = key_symbol.field_descriptor;

  if (key_field->is_repeated()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map_key must not name a repeated field.");
    return;
  }

  if (key_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map key must name a scalar or string field.");
    return;
  }

  field->experimental_map_key_ = key_field;
}